

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_>::InitializePage
          (ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *this,
          WindowPartitionInput *partition)

{
  undefined8 uVar1;
  void *__s;
  idx_t iVar2;
  long in_RSI;
  long in_RDI;
  vector<unsigned_long,_true> *in_stack_ffffffffffffff98;
  ColumnDataScanState *in_stack_ffffffffffffffa0;
  vector<unsigned_long,_true> *this_00;
  undefined1 local_28 [24];
  long local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x48) == 0) {
    __s = operator_new(0x80);
    memset(__s,0,0x80);
    ColumnDataScanState::ColumnDataScanState(in_stack_ffffffffffffffa0);
    *(void **)(in_RDI + 0x48) = __s;
  }
  iVar2 = DataChunk::ColumnCount((DataChunk *)0xb1ac03);
  if (iVar2 == 0) {
    *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(local_10 + 8);
    this_00 = *(vector<unsigned_long,_true> **)(in_RDI + 0x40);
    uVar1 = *(undefined8 *)(in_RDI + 0x48);
    vector<unsigned_long,_true>::vector(this_00,in_stack_ffffffffffffff98);
    duckdb::ColumnDataCollection::InitializeScan(this_00,uVar1,local_28,1);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xb1ac6e);
    duckdb::ColumnDataCollection::InitializeScanChunk
              (*(ColumnDataScanState **)(in_RDI + 0x40),*(DataChunk **)(in_RDI + 0x48));
  }
  return;
}

Assistant:

void InitializePage(const WindowPartitionInput &partition) {
		if (!scan) {
			scan = new ColumnDataScanState();
		}
		if (page.ColumnCount() == 0) {
			D_ASSERT(partition.inputs);
			inputs = partition.inputs;
			D_ASSERT(partition.column_ids.size() == 1);
			inputs->InitializeScan(*scan, partition.column_ids);
			inputs->InitializeScanChunk(*scan, page);
		}
	}